

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

DataStream * __thiscall
DataStream::operator<<(DataStream *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *obj)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (this,(long)(obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start);
  if ((obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (obj->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)this,
               (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

DataStream& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return (*this);
    }